

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O0

void __thiscall wasm::StackIROptimizer::vacuum(StackIROptimizer *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppSVar3;
  StackInst **inst;
  Index i;
  StackIROptimizer *this_local;
  
  for (inst._4_4_ = 0;
      sVar2 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::size(this->insts),
      inst._4_4_ < sVar2; inst._4_4_ = inst._4_4_ + 1) {
    ppSVar3 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                        (this->insts,(ulong)inst._4_4_);
    if ((*ppSVar3 != (value_type)0x0) &&
       (bVar1 = Expression::is<wasm::Nop>((*ppSVar3)->origin), bVar1)) {
      *ppSVar3 = (value_type)0x0;
    }
  }
  return;
}

Assistant:

void StackIROptimizer::vacuum() {
  // In the wasm binary format a nop is never needed. (In Binaryen IR, in
  // comparison, it is necessary e.g. in a function body or an if arm.)
  //
  // It is especially important to remove nops because we add nops when we
  // read wasm into Binaryen IR. That is, this avoids a potential increase in
  // code size.
  for (Index i = 0; i < insts.size(); i++) {
    auto*& inst = insts[i];
    if (inst && inst->origin->is<Nop>()) {
      inst = nullptr;
    }
  }
}